

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int f32_compare(float32 xa,float32 xb,_Bool is_quiet,float_status *s)

{
  uint uVar1;
  int iVar2;
  union_float32 ub;
  union_float32 ua;
  
  ub.s = xb;
  ua.s = xa;
  if (s->flush_inputs_to_zero != '\0') {
    float32_input_flush__nocheck(&ua.s,s);
    float32_input_flush__nocheck(&ub.s,s);
  }
  if (ub.h <= ua.h) {
    uVar1 = (uint)(ub.h < ua.h);
  }
  else {
    if (ub.h <= ua.h) {
      iVar2 = soft_f32_compare(ua.s,ub.s,is_quiet,s);
      return iVar2;
    }
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

static int QEMU_FLATTEN
f32_compare(float32 xa, float32 xb, bool is_quiet, float_status *s)
{
    union_float32 ua, ub;

    ua.s = xa;
    ub.s = xb;

    if (QEMU_NO_HARDFLOAT) {
        goto soft;
    }

    float32_input_flush2(&ua.s, &ub.s, s);
    if (isgreaterequal(ua.h, ub.h)) {
        if (isgreater(ua.h, ub.h)) {
            return float_relation_greater;
        }
        return float_relation_equal;
    }
    if (likely(isless(ua.h, ub.h))) {
        return float_relation_less;
    }
    /* The only condition remaining is unordered.
     * Fall through to set flags.
     */
 soft:
    return soft_f32_compare(ua.s, ub.s, is_quiet, s);
}